

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

QGraphicsEllipseItem * __thiscall QGraphicsEllipseItem::shape(QGraphicsEllipseItem *this)

{
  long lVar1;
  long in_RSI;
  long in_FS_OFFSET;
  QPainterPath path;
  QPointF local_30;
  
  local_30.yp = *(qreal *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(in_RSI + 8);
  local_30.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
  QPainterPath::QPainterPath((QPainterPath *)&local_30);
  if ((((*(double *)(lVar1 + 0x1b8) != 0.0) || (NAN(*(double *)(lVar1 + 0x1b8)))) ||
      (*(double *)(lVar1 + 0x1c0) != 0.0)) || (NAN(*(double *)(lVar1 + 0x1c0)))) {
    if (*(int *)(lVar1 + 0x1cc) == 0x1680) {
      QPainterPath::addEllipse((QRectF *)&local_30);
    }
    else {
      QRectF::center((QRectF *)(lVar1 + 0x1a8));
      QPainterPath::moveTo(&local_30);
      QPainterPath::arcTo((QRectF *)&local_30,(double)*(int *)(lVar1 + 0x1c8) * 0.0625,
                          (double)*(int *)(lVar1 + 0x1cc) * 0.0625);
    }
    qt_graphicsItem_shapeFromPath((QPainterPath *)this,(QPen *)&local_30);
  }
  else {
    QPainterPath::QPainterPath((QPainterPath *)this,(QPainterPath *)&local_30);
  }
  QPainterPath::~QPainterPath((QPainterPath *)&local_30);
  if (*(qreal *)(in_FS_OFFSET + 0x28) == local_30.yp) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QPainterPath QGraphicsEllipseItem::shape() const
{
    Q_D(const QGraphicsEllipseItem);
    QPainterPath path;
    if (d->rect.isNull())
        return path;
    if (d->spanAngle != 360 * 16) {
        path.moveTo(d->rect.center());
        path.arcTo(d->rect, d->startAngle / 16.0, d->spanAngle / 16.0);
    } else {
        path.addEllipse(d->rect);
    }

    return qt_graphicsItem_shapeFromPath(path, d->pen);
}